

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kd_tree_attributes_encoder.cc
# Opt level: O0

bool __thiscall
draco::KdTreeAttributesEncoder::TransformAttributesToPortableFormat(KdTreeAttributesEncoder *this)

{
  uint uVar1;
  byte bVar2;
  bool bVar3;
  ValueType VVar4;
  uint32_t uVar5;
  DataType DVar6;
  int iVar7;
  PointCloudEncoder *pPVar8;
  PointCloud *this_00;
  reference pvVar9;
  AttributesEncoder *in_RDI;
  float fVar10;
  int c_1;
  int c;
  AttributeValueIndex avi;
  vector<int,_std::allocator<int>_> act_value;
  vector<int,_std::allocator<int>_> min_value;
  unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_> portable_att;
  float range;
  vector<float,_std::allocator<float>_> quantization_origin;
  int quantization_bits;
  AttributeQuantizationTransform attribute_quantization_transform;
  PointAttribute *att_1;
  int att_id_1;
  uint32_t i_1;
  PointAttribute *att;
  int att_id;
  uint32_t i;
  int num_components;
  size_t num_points;
  pointer *in_stack_fffffffffffffcd8;
  float in_stack_fffffffffffffce0;
  float in_stack_fffffffffffffce4;
  value_type in_stack_fffffffffffffce8;
  value_type in_stack_fffffffffffffcec;
  int in_stack_fffffffffffffcf0;
  AttributeValueIndex in_stack_fffffffffffffcf4;
  PointAttribute *in_stack_fffffffffffffcf8;
  undefined7 in_stack_fffffffffffffd00;
  undefined1 in_stack_fffffffffffffd07;
  PointAttribute *in_stack_fffffffffffffd08;
  AttributeQuantizationTransform *in_stack_fffffffffffffd10;
  char *in_stack_fffffffffffffd18;
  undefined7 in_stack_fffffffffffffd20;
  byte in_stack_fffffffffffffd27;
  EncoderOptions *in_stack_fffffffffffffd88;
  PointCloudEncoder *in_stack_fffffffffffffd90;
  AttributeTransform *in_stack_fffffffffffffd98;
  bool local_232;
  float local_1e8;
  int local_1e4;
  uint local_1dc;
  IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_> local_1d8;
  int in_stack_fffffffffffffe2c;
  PointAttribute *in_stack_fffffffffffffe30;
  AttributeQuantizationTransform *in_stack_fffffffffffffe38;
  vector<int,_std::allocator<int>_> local_1b0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  allocator<char> local_169;
  string local_168 [32];
  float local_148;
  allocator<char> local_141;
  string local_140 [40];
  vector<float,_std::allocator<float>_> local_118;
  byte local_fb;
  byte local_fa;
  allocator<char> local_f9;
  string local_f8 [39];
  allocator<char> local_d1;
  string local_d0 [32];
  int local_b0;
  allocator<char> local_a9;
  string local_a8 [52];
  int local_74;
  PointAttribute *local_40;
  int32_t local_38;
  uint local_34;
  PointAttribute *local_30;
  int32_t local_24;
  uint local_20;
  int local_1c;
  ulong local_18;
  byte local_1;
  
  pPVar8 = AttributesEncoder::encoder(in_RDI);
  this_00 = PointCloudEncoder::point_cloud(pPVar8);
  VVar4 = PointCloud::num_points(this_00);
  local_18 = (ulong)VVar4;
  local_1c = 0;
  for (local_20 = 0; uVar1 = local_20,
      uVar5 = AttributesEncoder::num_attributes((AttributesEncoder *)0x222fff), uVar1 < uVar5;
      local_20 = local_20 + 1) {
    local_24 = AttributesEncoder::GetAttributeId
                         ((AttributesEncoder *)
                          CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                          (int)((ulong)in_stack_fffffffffffffcd8 >> 0x20));
    pPVar8 = AttributesEncoder::encoder(in_RDI);
    PointCloudEncoder::point_cloud(pPVar8);
    local_30 = PointCloud::attribute
                         ((PointCloud *)
                          CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                          (int32_t)((ulong)in_stack_fffffffffffffcd8 >> 0x20));
    bVar2 = GeometryAttribute::num_components(&local_30->super_GeometryAttribute);
    local_1c = (uint)bVar2 + local_1c;
  }
  *(int *)&in_RDI[2]._vptr_AttributesEncoder = local_1c;
  for (local_34 = 0; uVar1 = local_34,
      uVar5 = AttributesEncoder::num_attributes((AttributesEncoder *)0x2230c2), uVar1 < uVar5;
      local_34 = local_34 + 1) {
    local_38 = AttributesEncoder::GetAttributeId
                         ((AttributesEncoder *)
                          CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                          (int)((ulong)in_stack_fffffffffffffcd8 >> 0x20));
    pPVar8 = AttributesEncoder::encoder(in_RDI);
    PointCloudEncoder::point_cloud(pPVar8);
    local_40 = PointCloud::attribute
                         ((PointCloud *)
                          CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                          (int32_t)((ulong)in_stack_fffffffffffffcd8 >> 0x20));
    DVar6 = GeometryAttribute::data_type(&local_40->super_GeometryAttribute);
    if (DVar6 == DT_FLOAT32) {
      AttributeQuantizationTransform::AttributeQuantizationTransform
                ((AttributeQuantizationTransform *)
                 CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0));
      pPVar8 = AttributesEncoder::encoder(in_RDI);
      PointCloudEncoder::options(pPVar8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffd27,in_stack_fffffffffffffd20),
                 in_stack_fffffffffffffd18,(allocator<char> *)in_stack_fffffffffffffd10);
      iVar7 = DracoOptions<int>::GetAttributeInt
                        ((DracoOptions<int> *)in_stack_fffffffffffffcf8,
                         (AttributeKey *)
                         CONCAT44(in_stack_fffffffffffffcf4.value_,in_stack_fffffffffffffcf0),
                         (string *)CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8),
                         (int)in_stack_fffffffffffffce4);
      std::__cxx11::string::~string(local_a8);
      std::allocator<char>::~allocator(&local_a9);
      local_74 = iVar7;
      if (iVar7 < 1) {
        local_1 = 0;
        local_b0 = 1;
      }
      else {
        local_fa = 0;
        local_fb = 0;
        pPVar8 = AttributesEncoder::encoder(in_RDI);
        PointCloudEncoder::options(pPVar8);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffd27,in_stack_fffffffffffffd20),
                   in_stack_fffffffffffffd18,(allocator<char> *)in_stack_fffffffffffffd10);
        bVar3 = DracoOptions<int>::IsAttributeOptionSet
                          ((DracoOptions<int> *)in_stack_fffffffffffffcf8,
                           (AttributeKey *)
                           CONCAT44(in_stack_fffffffffffffcf4.value_,in_stack_fffffffffffffcf0),
                           (string *)CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
        local_232 = false;
        if (bVar3) {
          pPVar8 = AttributesEncoder::encoder(in_RDI);
          PointCloudEncoder::options(pPVar8);
          std::allocator<char>::allocator();
          local_fa = 1;
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffffd27,in_stack_fffffffffffffd20),
                     in_stack_fffffffffffffd18,(allocator<char> *)in_stack_fffffffffffffd10);
          local_fb = 1;
          local_232 = DracoOptions<int>::IsAttributeOptionSet
                                ((DracoOptions<int> *)in_stack_fffffffffffffcf8,
                                 (AttributeKey *)
                                 CONCAT44(in_stack_fffffffffffffcf4.value_,in_stack_fffffffffffffcf0
                                         ),
                                 (string *)
                                 CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
        }
        if ((local_fb & 1) != 0) {
          std::__cxx11::string::~string(local_f8);
        }
        if ((local_fa & 1) != 0) {
          std::allocator<char>::~allocator(&local_f9);
        }
        std::__cxx11::string::~string(local_d0);
        std::allocator<char>::~allocator(&local_d1);
        if (local_232 == false) {
          bVar3 = AttributeQuantizationTransform::ComputeParameters
                            (in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,
                             in_stack_fffffffffffffe2c);
          if (!bVar3) {
            local_1 = 0;
            local_b0 = 1;
            goto LAB_00223958;
          }
        }
        else {
          bVar2 = GeometryAttribute::num_components(&local_40->super_GeometryAttribute);
          in_stack_fffffffffffffd98 = (AttributeTransform *)(ulong)bVar2;
          std::allocator<float>::allocator((allocator<float> *)0x223474);
          std::vector<float,_std::allocator<float>_>::vector
                    ((vector<float,_std::allocator<float>_> *)
                     CONCAT17(in_stack_fffffffffffffd07,in_stack_fffffffffffffd00),
                     (size_type)in_stack_fffffffffffffcf8,
                     (allocator_type *)
                     CONCAT44(in_stack_fffffffffffffcf4.value_,in_stack_fffffffffffffcf0));
          std::allocator<float>::~allocator((allocator<float> *)0x2234a0);
          in_stack_fffffffffffffd90 = AttributesEncoder::encoder(in_RDI);
          in_stack_fffffffffffffd88 = PointCloudEncoder::options(in_stack_fffffffffffffd90);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffffd27,in_stack_fffffffffffffd20),
                     in_stack_fffffffffffffd18,(allocator<char> *)in_stack_fffffffffffffd10);
          GeometryAttribute::num_components(&local_40->super_GeometryAttribute);
          std::vector<float,_std::allocator<float>_>::operator[](&local_118,0);
          DracoOptions<int>::GetAttributeVector<float>
                    ((DracoOptions<int> *)in_stack_fffffffffffffd08,
                     (AttributeKey *)CONCAT17(in_stack_fffffffffffffd07,in_stack_fffffffffffffd00),
                     (string *)in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf4.value_,
                     (float *)CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
          std::__cxx11::string::~string(local_140);
          std::allocator<char>::~allocator(&local_141);
          pPVar8 = AttributesEncoder::encoder(in_RDI);
          PointCloudEncoder::options(pPVar8);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffffd27,in_stack_fffffffffffffd20),
                     in_stack_fffffffffffffd18,(allocator<char> *)in_stack_fffffffffffffd10);
          fVar10 = DracoOptions<int>::GetAttributeFloat
                             ((DracoOptions<int> *)in_stack_fffffffffffffcf8,
                              (AttributeKey *)
                              CONCAT44(in_stack_fffffffffffffcf4.value_,in_stack_fffffffffffffcf0),
                              (string *)
                              CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8),
                              in_stack_fffffffffffffce4);
          std::__cxx11::string::~string(local_168);
          std::allocator<char>::~allocator(&local_169);
          local_148 = fVar10;
          std::vector<float,_std::allocator<float>_>::data
                    ((vector<float,_std::allocator<float>_> *)0x223651);
          GeometryAttribute::num_components(&local_40->super_GeometryAttribute);
          AttributeQuantizationTransform::SetParameters
                    ((AttributeQuantizationTransform *)in_stack_fffffffffffffcf8,
                     in_stack_fffffffffffffcf4.value_,
                     (float *)CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8),
                     (int)in_stack_fffffffffffffce4,in_stack_fffffffffffffce0);
          std::vector<float,_std::allocator<float>_>::~vector
                    ((vector<float,_std::allocator<float>_> *)
                     CONCAT44(in_stack_fffffffffffffcf4.value_,in_stack_fffffffffffffcf0));
        }
        std::
        vector<draco::AttributeQuantizationTransform,_std::allocator<draco::AttributeQuantizationTransform>_>
        ::push_back((vector<draco::AttributeQuantizationTransform,_std::allocator<draco::AttributeQuantizationTransform>_>
                     *)CONCAT44(in_stack_fffffffffffffcf4.value_,in_stack_fffffffffffffcf0),
                    (value_type *)CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
        AttributeTransform::InitTransformedAttribute
                  (in_stack_fffffffffffffd98,(PointAttribute *)in_stack_fffffffffffffd90,
                   (int)((ulong)in_stack_fffffffffffffd88 >> 0x20));
        local_198 = 0;
        uStack_190 = 0;
        local_188 = 0;
        std::
        vector<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
        ::vector((vector<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
                  *)0x2238ef);
        std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>::get
                  ((unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_> *
                   )CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0));
        AttributeQuantizationTransform::TransformAttribute
                  (in_stack_fffffffffffffd10,in_stack_fffffffffffffd08,
                   (vector<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
                    *)CONCAT17(in_stack_fffffffffffffd07,in_stack_fffffffffffffd00),
                   in_stack_fffffffffffffcf8);
        std::
        vector<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
        ::~vector((vector<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
                   *)CONCAT44(in_stack_fffffffffffffcf4.value_,in_stack_fffffffffffffcf0));
        std::
        vector<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
        ::push_back((vector<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
                     *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                    (value_type *)in_stack_fffffffffffffcd8);
        std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>::
        ~unique_ptr((unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
                     *)CONCAT44(in_stack_fffffffffffffcf4.value_,in_stack_fffffffffffffcf0));
        local_b0 = 0;
      }
LAB_00223958:
      AttributeQuantizationTransform::~AttributeQuantizationTransform
                ((AttributeQuantizationTransform *)
                 CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0));
      if (local_b0 != 0) goto LAB_00223d9d;
    }
    else {
      DVar6 = GeometryAttribute::data_type(&local_40->super_GeometryAttribute);
      if (((DVar6 == DT_INT32) ||
          (DVar6 = GeometryAttribute::data_type(&local_40->super_GeometryAttribute),
          DVar6 == DT_INT16)) ||
         (DVar6 = GeometryAttribute::data_type(&local_40->super_GeometryAttribute), DVar6 == DT_INT8
         )) {
        GeometryAttribute::num_components(&local_40->super_GeometryAttribute);
        std::numeric_limits<int>::max();
        std::allocator<int>::allocator((allocator<int> *)0x223a3f);
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)
                   CONCAT17(in_stack_fffffffffffffd07,in_stack_fffffffffffffd00),
                   (size_type)in_stack_fffffffffffffcf8,
                   (value_type_conflict1 *)
                   CONCAT44(in_stack_fffffffffffffcf4.value_,in_stack_fffffffffffffcf0),
                   (allocator_type *)CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
        std::allocator<int>::~allocator((allocator<int> *)0x223a6d);
        in_stack_fffffffffffffd27 =
             GeometryAttribute::num_components(&local_40->super_GeometryAttribute);
        in_stack_fffffffffffffd10 =
             (AttributeQuantizationTransform *)(ulong)in_stack_fffffffffffffd27;
        in_stack_fffffffffffffd18 = &stack0xfffffffffffffe2f;
        std::allocator<int>::allocator((allocator<int> *)0x223a9e);
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)
                   CONCAT17(in_stack_fffffffffffffd07,in_stack_fffffffffffffd00),
                   (size_type)in_stack_fffffffffffffcf8,
                   (allocator_type *)
                   CONCAT44(in_stack_fffffffffffffcf4.value_,in_stack_fffffffffffffcf0));
        std::allocator<int>::~allocator((allocator<int> *)0x223ac4);
        IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>::IndexType(&local_1d8,0);
        while( true ) {
          in_stack_fffffffffffffd08 = (PointAttribute *)PointAttribute::size(local_40);
          local_1dc = (uint)in_stack_fffffffffffffd08;
          in_stack_fffffffffffffd07 =
               IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>::operator<
                         (&local_1d8,&local_1dc);
          if (!(bool)in_stack_fffffffffffffd07) break;
          in_stack_fffffffffffffcf8 = local_40;
          std::vector<int,_std::allocator<int>_>::operator[]
                    ((vector<int,_std::allocator<int>_> *)&stack0xfffffffffffffe30,0);
          GeometryAttribute::ConvertValue<int>
                    ((GeometryAttribute *)
                     CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8),
                     in_stack_fffffffffffffcf4,
                     (int *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0));
          local_1e4 = 0;
          while( true ) {
            in_stack_fffffffffffffcf0 = local_1e4;
            bVar2 = GeometryAttribute::num_components(&local_40->super_GeometryAttribute);
            in_stack_fffffffffffffcf4.value_ =
                 CONCAT13(bVar2,(int3)in_stack_fffffffffffffcf4.value_);
            if ((int)(uint)bVar2 <= in_stack_fffffffffffffcf0) break;
            pvVar9 = std::vector<int,_std::allocator<int>_>::operator[](&local_1b0,(long)local_1e4);
            in_stack_fffffffffffffcec = *pvVar9;
            pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)&stack0xfffffffffffffe30,
                                (long)local_1e4);
            if (*pvVar9 < in_stack_fffffffffffffcec) {
              pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                                 ((vector<int,_std::allocator<int>_> *)&stack0xfffffffffffffe30,
                                  (long)local_1e4);
              in_stack_fffffffffffffce8 = *pvVar9;
              pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                                 (&local_1b0,(long)local_1e4);
              *pvVar9 = in_stack_fffffffffffffce8;
            }
            local_1e4 = local_1e4 + 1;
          }
          IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>::operator++(&local_1d8);
        }
        local_1e8 = 0.0;
        while( true ) {
          in_stack_fffffffffffffce0 = local_1e8;
          bVar2 = GeometryAttribute::num_components(&local_40->super_GeometryAttribute);
          in_stack_fffffffffffffce4 = (float)CONCAT13(bVar2,SUB43(in_stack_fffffffffffffce4,0));
          if ((int)(uint)bVar2 <= (int)in_stack_fffffffffffffce0) break;
          in_stack_fffffffffffffcd8 =
               &in_RDI[1].point_attribute_ids_.super__Vector_base<int,_std::allocator<int>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage;
          std::vector<int,_std::allocator<int>_>::operator[](&local_1b0,(long)(int)local_1e8);
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)
                     CONCAT44(in_stack_fffffffffffffcf4.value_,in_stack_fffffffffffffcf0),
                     (value_type_conflict1 *)
                     CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
          local_1e8 = (float)((int)local_1e8 + 1);
        }
        std::vector<int,_std::allocator<int>_>::~vector
                  ((vector<int,_std::allocator<int>_> *)
                   CONCAT44(in_stack_fffffffffffffcf4.value_,in_stack_fffffffffffffcf0));
        std::vector<int,_std::allocator<int>_>::~vector
                  ((vector<int,_std::allocator<int>_> *)
                   CONCAT44(in_stack_fffffffffffffcf4.value_,in_stack_fffffffffffffcf0));
      }
    }
  }
  local_1 = 1;
LAB_00223d9d:
  return (bool)(local_1 & 1);
}

Assistant:

bool KdTreeAttributesEncoder::TransformAttributesToPortableFormat() {
  // Convert any of the input attributes into a format that can be processed by
  // the kd tree encoder (quantization of floating attributes for now).
  const size_t num_points = encoder()->point_cloud()->num_points();
  int num_components = 0;
  for (uint32_t i = 0; i < num_attributes(); ++i) {
    const int att_id = GetAttributeId(i);
    const PointAttribute *const att =
        encoder()->point_cloud()->attribute(att_id);
    num_components += att->num_components();
  }
  num_components_ = num_components;

  // Go over all attributes and quantize them if needed.
  for (uint32_t i = 0; i < num_attributes(); ++i) {
    const int att_id = GetAttributeId(i);
    const PointAttribute *const att =
        encoder()->point_cloud()->attribute(att_id);
    if (att->data_type() == DT_FLOAT32) {
      // Quantization path.
      AttributeQuantizationTransform attribute_quantization_transform;
      const int quantization_bits = encoder()->options()->GetAttributeInt(
          att_id, "quantization_bits", -1);
      if (quantization_bits < 1) {
        return false;
      }
      if (encoder()->options()->IsAttributeOptionSet(att_id,
                                                     "quantization_origin") &&
          encoder()->options()->IsAttributeOptionSet(att_id,
                                                     "quantization_range")) {
        // Quantization settings are explicitly specified in the provided
        // options.
        std::vector<float> quantization_origin(att->num_components());
        encoder()->options()->GetAttributeVector(att_id, "quantization_origin",
                                                 att->num_components(),
                                                 &quantization_origin[0]);
        const float range = encoder()->options()->GetAttributeFloat(
            att_id, "quantization_range", 1.f);
        attribute_quantization_transform.SetParameters(
            quantization_bits, quantization_origin.data(),
            att->num_components(), range);
      } else {
        // Compute quantization settings from the attribute values.
        if (!attribute_quantization_transform.ComputeParameters(
                *att, quantization_bits)) {
          return false;
        }
      }
      attribute_quantization_transforms_.push_back(
          attribute_quantization_transform);
      // Store the quantized attribute in an array that will be used when we do
      // the actual encoding of the data.
      auto portable_att =
          attribute_quantization_transform.InitTransformedAttribute(*att,
                                                                    num_points);
      attribute_quantization_transform.TransformAttribute(*att, {},
                                                          portable_att.get());
      quantized_portable_attributes_.push_back(std::move(portable_att));
    } else if (att->data_type() == DT_INT32 || att->data_type() == DT_INT16 ||
               att->data_type() == DT_INT8) {
      // For signed types, find the minimum value for each component. These
      // values are going to be used to transform the attribute values to
      // unsigned integers that can be processed by the core kd tree algorithm.
      std::vector<int32_t> min_value(att->num_components(),
                                     std::numeric_limits<int32_t>::max());
      std::vector<int32_t> act_value(att->num_components());
      for (AttributeValueIndex avi(0); avi < static_cast<uint32_t>(att->size());
           ++avi) {
        att->ConvertValue<int32_t>(avi, &act_value[0]);
        for (int c = 0; c < att->num_components(); ++c) {
          if (min_value[c] > act_value[c]) {
            min_value[c] = act_value[c];
          }
        }
      }
      for (int c = 0; c < att->num_components(); ++c) {
        min_signed_values_.push_back(min_value[c]);
      }
    }
  }
  return true;
}